

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

CappedArray<char,_26UL> * __thiscall
kj::_::Stringifier::operator*
          (CappedArray<char,_26UL> *__return_storage_ptr__,Stringifier *this,unsigned_long i)

{
  bool bVar1;
  char *pcVar2;
  unsigned_long u;
  uint8_t *puVar3;
  uint8_t reverse [25];
  
  __return_storage_ptr__->currentSize = 0x1a;
  reverse[0x10] = '\0';
  reverse[0x11] = '\0';
  reverse[0x12] = '\0';
  reverse[0x13] = '\0';
  reverse[0x14] = '\0';
  reverse[0x15] = '\0';
  reverse[0x16] = '\0';
  reverse[0x17] = '\0';
  reverse[0x18] = '\0';
  reverse[0] = '\0';
  reverse[1] = '\0';
  reverse[2] = '\0';
  reverse[3] = '\0';
  reverse[4] = '\0';
  reverse[5] = '\0';
  reverse[6] = '\0';
  reverse[7] = '\0';
  reverse[8] = '\0';
  reverse[9] = '\0';
  reverse[10] = '\0';
  reverse[0xb] = '\0';
  reverse[0xc] = '\0';
  reverse[0xd] = '\0';
  reverse[0xe] = '\0';
  reverse[0xf] = '\0';
  if (i == 0) {
    puVar3 = reverse + 1;
    reverse[0] = '\0';
    reverse[1] = '\0';
    reverse[2] = '\0';
    reverse[3] = '\0';
    reverse[4] = '\0';
    reverse[5] = '\0';
    reverse[6] = '\0';
    reverse[7] = '\0';
  }
  else {
    puVar3 = reverse;
    do {
      *puVar3 = (char)i + (char)(i / 10) * -10;
      puVar3 = puVar3 + 1;
      bVar1 = 9 < i;
      i = i / 10;
    } while (bVar1);
  }
  pcVar2 = __return_storage_ptr__->content;
  for (; reverse < puVar3; puVar3 = puVar3 + -1) {
    *pcVar2 = puVar3[-1] + '0';
    pcVar2 = pcVar2 + 1;
  }
  __return_storage_ptr__->currentSize = (long)pcVar2 - (long)__return_storage_ptr__->content;
  return __return_storage_ptr__;
}

Assistant:

CappedArray(): currentSize(fixedSize) {}